

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMoveToSr<(moira::Instr)76,(moira::Mode)8,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  StrWriter *this_00;
  Ea<(moira::Mode)8,_2> src;
  Ea<(moira::Mode)8,_2> local_2c;
  
  Op<(moira::Mode)8,2>(&local_2c,this,op & 7,addr);
  SVar1 = str->style->syntax;
  this_00 = StrWriter::operator<<(str);
  if (SVar1 != MUSASHI) {
    this_00 = StrWriter::operator<<(this_00);
  }
  StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
  StrWriter::operator<<(this_00,&local_2c);
  StrWriter::operator<<(this_00);
  StrWriter::operator<<(this_00);
  return;
}

Assistant:

void
Moira::dasmMoveToSr(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S> ( _____________xxx(op), addr );

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << str.tab << src << Sep{} << Sr{};
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << Sr{};
    }
}